

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMNormalizer::error(DOMNormalizer *this,Codes code,DOMNode *node)

{
  char cVar1;
  Codes *pCVar2;
  ErrorSeverity severity;
  undefined4 in_register_00000034;
  DOMErrorImpl domError;
  XMLCh errText [2048];
  DOMErrorImpl DStack_1058;
  XMLCh local_1028 [2048];
  
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    (**(code **)(*gMsgLoader + 0x10))
              (gMsgLoader,CONCAT44(in_register_00000034,code),local_1028,0x7ff);
    severity = DOM_SEVERITY_WARNING;
    if (10 < code - W_LowBounds) {
      severity = (code - F_LowBounds < 0x85) + DOM_SEVERITY_ERROR;
    }
    DOMErrorImpl::DOMErrorImpl(&DStack_1058,severity,(XMLCh *)0x0,local_1028,node);
    cVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,&DStack_1058);
    if (cVar1 == '\0') {
      pCVar2 = (Codes *)__cxa_allocate_exception(4);
      *pCVar2 = code;
      __cxa_throw(pCVar2,&XMLErrs::Codes::typeinfo,0);
    }
    DOMErrorImpl::~DOMErrorImpl(&DStack_1058);
  }
  return;
}

Assistant:

void DOMNormalizer::error(const XMLErrs::Codes code, const DOMNode *node) const
{
    if (fErrorHandler) {

        //  Load the message into alocal and replace any tokens found in
        //  the text.
        const XMLSize_t maxChars = 2047;
        XMLCh errText[maxChars + 1];

        if (!gMsgLoader->loadMsg(code, errText, maxChars))
        {
                // <TBD> Should probably load a default message here
        }

        DOMErrorImpl domError(
          XMLErrs::DOMErrorType (code), 0, errText, (void*)node);
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess)
            throw (XMLErrs::Codes) code;
    }
}